

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::visit<slang::ast::ClockingEventExpression>
          (SequenceMethodExprVisitor *this,ClockingEventExpression *expr)

{
  bool bVar1;
  Symbol *this_00;
  AssertionPortSymbol *this_01;
  Diagnostic *this_02;
  Symbol *sym;
  ClockingEventExpression *expr_local;
  SequenceMethodExprVisitor *this_local;
  
  if (((expr->super_Expression).kind != NamedValue) ||
     (this_00 = Expression::getSymbolReference(&expr->super_Expression,true),
     this_00 == (Symbol *)0x0)) goto LAB_00608d8f;
  if (this_00->kind != LocalAssertionVar) {
    if (this_00->kind != AssertionPort) goto LAB_00608d8f;
    this_01 = Symbol::as<slang::ast::AssertionPortSymbol>(this_00);
    bVar1 = AssertionPortSymbol::isLocalVar(this_01);
    if (!bVar1) goto LAB_00608d8f;
  }
  this_02 = ASTContext::addDiag(this->context,(DiagCode)0x23000b,
                                (expr->super_Expression).sourceRange);
  Diagnostic::operator<<(this_02,&this->name);
LAB_00608d8f:
  ClockingEventExpression::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>(expr,this);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }